

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlNoNetExternalEntityLoader(void)

{
  int iVar1;
  int iVar2;
  char *val;
  char *val_00;
  xmlParserCtxtPtr val_01;
  xmlParserInputPtr val_02;
  int local_44;
  int n_ctxt;
  xmlParserCtxtPtr ctxt;
  int n_ID;
  char *ID;
  int n_URL;
  char *URL;
  xmlParserInputPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (ID._4_4_ = 0; (int)ID._4_4_ < 8; ID._4_4_ = ID._4_4_ + 1) {
    for (ctxt._4_4_ = 0; (int)ctxt._4_4_ < 4; ctxt._4_4_ = ctxt._4_4_ + 1) {
      for (local_44 = 0; local_44 < 3; local_44 = local_44 + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_filepath(ID._4_4_,0);
        val_00 = gen_const_char_ptr(ctxt._4_4_,1);
        val_01 = gen_xmlParserCtxtPtr(local_44,2);
        val_02 = (xmlParserInputPtr)xmlNoNetExternalEntityLoader(val,val_00,val_01);
        desret_xmlParserInputPtr(val_02);
        call_tests = call_tests + 1;
        des_filepath(ID._4_4_,val,0);
        des_const_char_ptr(ctxt._4_4_,val_00,1);
        des_xmlParserCtxtPtr(local_44,val_01,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNoNetExternalEntityLoader",
                 (ulong)(uint)(iVar2 - iVar1));
          ret_val._4_4_ = ret_val._4_4_ + 1;
          printf(" %d",(ulong)ID._4_4_);
          printf(" %d",(ulong)ctxt._4_4_);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlNoNetExternalEntityLoader(void) {
    int test_ret = 0;

    int mem_base;
    xmlParserInputPtr ret_val;
    const char * URL; /* the URL for the entity to load */
    int n_URL;
    char * ID; /* the System ID for the entity to load */
    int n_ID;
    xmlParserCtxtPtr ctxt; /* the context in which the entity is called or NULL */
    int n_ctxt;

    for (n_URL = 0;n_URL < gen_nb_filepath;n_URL++) {
    for (n_ID = 0;n_ID < gen_nb_const_char_ptr;n_ID++) {
    for (n_ctxt = 0;n_ctxt < gen_nb_xmlParserCtxtPtr;n_ctxt++) {
        mem_base = xmlMemBlocks();
        URL = gen_filepath(n_URL, 0);
        ID = gen_const_char_ptr(n_ID, 1);
        ctxt = gen_xmlParserCtxtPtr(n_ctxt, 2);

        ret_val = xmlNoNetExternalEntityLoader(URL, (const char *)ID, ctxt);
        desret_xmlParserInputPtr(ret_val);
        call_tests++;
        des_filepath(n_URL, URL, 0);
        des_const_char_ptr(n_ID, (const char *)ID, 1);
        des_xmlParserCtxtPtr(n_ctxt, ctxt, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlNoNetExternalEntityLoader",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_URL);
            printf(" %d", n_ID);
            printf(" %d", n_ctxt);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}